

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O3

void __thiscall MapLoader::setMapFile(MapLoader *this,string *newMapFile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  string *psVar4;
  
  psVar4 = (string *)operator_new(0x20);
  (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
  pcVar2 = (newMapFile->_M_dataplus)._M_p;
  paVar1 = &newMapFile->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&newMapFile->field_2 + 8);
    (psVar4->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&psVar4->field_2 + 8) = uVar3;
  }
  else {
    (psVar4->_M_dataplus)._M_p = pcVar2;
    (psVar4->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  psVar4->_M_string_length = newMapFile->_M_string_length;
  (newMapFile->_M_dataplus)._M_p = (pointer)paVar1;
  newMapFile->_M_string_length = 0;
  (newMapFile->field_2)._M_local_buf[0] = '\0';
  this->pMapFile = psVar4;
  return;
}

Assistant:

void MapLoader::setMapFile(std::string newMapFile) {
    pMapFile = new std::string(std::move(newMapFile));
}